

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbmphandler.cpp
# Opt level: O2

bool read_dib_body(QDataStream *s,BMP_INFOHDR *bi,qint64 datapos,qint64 startpos,QImage *image)

{
  ushort uVar1;
  Representation RVar2;
  long *plVar3;
  Representation RVar4;
  uint3 uVar5;
  char cVar6;
  bool bVar7;
  byte bVar8;
  quint32 qVar9;
  QRgb QVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  QRgb c;
  long lVar17;
  ulong uVar18;
  qsizetype qVar19;
  uchar *__s;
  long lVar20;
  uint *puVar21;
  byte *pbVar22;
  ulong uVar23;
  void *pvVar24;
  bool bVar25;
  int colorCount;
  uint uVar26;
  long lVar27;
  int i;
  uint uVar28;
  int i_00;
  byte *pbVar29;
  ulong uVar30;
  Format format;
  QSize size;
  uint *puVar31;
  uint uVar32;
  Representation RVar33;
  undefined1 *puVar34;
  uchar *__s_00;
  uchar *puVar35;
  long in_FS_OFFSET;
  uint local_f0;
  byte local_d0;
  byte local_cc;
  uint local_c8;
  byte local_c4;
  int local_a8;
  uint local_a0;
  uint local_94;
  uint local_90;
  quint8 tmp;
  uint alpha_mask;
  uint blue_mask;
  uint green_mask;
  uint red_mask;
  quint8 b;
  undefined3 uStack_3b;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar3 = *(long **)(s + 8);
  cVar6 = (**(code **)(*plVar3 + 0x90))(plVar3);
  if (cVar6 != '\0') goto LAB_00255c14;
  iVar11 = bi->biSize;
  RVar2.m_i = bi->biWidth;
  uVar32 = bi->biHeight;
  uVar1 = bi->biBitCount;
  iVar12 = bi->biCompression;
  red_mask = 0;
  green_mask = 0;
  uVar28 = (uint)uVar1;
  blue_mask = 0;
  alpha_mask = 0;
  cVar6 = (**(code **)(*plVar3 + 0x60))();
  if (cVar6 == '\0') {
    (**(code **)(*plVar3 + 0x88))(plVar3,bi->biSize + startpos);
  }
  uVar26 = iVar12 - 5;
  if (bi->biSize < 0x6c) {
    qVar9 = 0;
    if (uVar26 < 0xfffffffe) goto LAB_002559ff;
    bVar8 = 1;
    if ((uVar28 != 0x20) && (uVar28 != 0x10)) goto LAB_00255ac3;
    lVar17 = QIODevice::read((char *)plVar3,(longlong)&red_mask);
    if ((lVar17 == 4) &&
       ((lVar17 = QIODevice::read((char *)plVar3,(longlong)&green_mask), lVar17 == 4 &&
        (lVar17 = QIODevice::read((char *)plVar3,(longlong)&blue_mask), lVar17 == 4)))) {
      if (iVar12 == 4) {
        lVar17 = QIODevice::read((char *)plVar3,(longlong)&alpha_mask);
        bVar8 = 1;
        if (lVar17 != 4) goto LAB_00255c14;
      }
      else {
        bVar8 = 1;
      }
      goto LAB_00255ac3;
    }
  }
  else {
    red_mask = bi->biRedMask;
    green_mask = bi->biGreenMask;
    blue_mask = bi->biBlueMask;
    alpha_mask = bi->biAlphaMask;
    bVar8 = 1;
    qVar9 = alpha_mask;
    if (0xfffffffd < uVar26) goto LAB_00255ac3;
LAB_002559ff:
    if (uVar1 == 0x20 && iVar12 == 0) {
      bVar25 = qVar9 == 0xff000000;
LAB_00255b0e:
      format = bVar25 | Format_RGB32;
      colorCount = 0;
    }
    else {
      bVar8 = 0;
LAB_00255ac3:
      bVar7 = false;
      if (0x20 < uVar28) goto LAB_00255c1c;
      bVar25 = (bool)(bVar8 & alpha_mask != 0);
      uVar18 = (ulong)uVar28;
      if ((0x101010000U >> (uVar18 & 0x3f) & 1) != 0) goto LAB_00255b0e;
      format = Format_Mono;
      if ((0x110UL >> (uVar18 & 0x3f) & 1) == 0) {
        if (uVar18 != 1) goto LAB_00255c1c;
      }
      else {
        format = Format_Indexed8;
      }
      colorCount = 1 << ((byte)uVar1 & 0x1f);
      if (bi->biClrUsed != 0) {
        colorCount = bi->biClrUsed;
      }
      if (colorCount - 0x101U < 0xffffff00) goto LAB_00255c14;
    }
    RVar4.m_i = -uVar32;
    if (-1 < bi->biHeight) {
      RVar4.m_i = uVar32;
    }
    size.ht.m_i = RVar4.m_i;
    size.wd.m_i = RVar2.m_i;
    bVar7 = QImageIOHandler::allocateImage(size,format,image);
    uVar14 = red_mask;
    uVar13 = alpha_mask;
    if (bVar7) {
      if (colorCount == 0) {
        if (uVar26 < 0xfffffffe) {
          local_94 = 0;
          if (iVar12 == 0) {
            if (uVar1 == 0x10) {
              blue_mask = 0x1f;
              green_mask = 0x3e0;
              red_mask = 0x7c00;
              local_a0._0_1_ = 10;
              local_c4 = 5;
              local_c8 = 3;
              local_f0 = 3;
              local_90 = 3;
              local_d0 = 0;
              local_cc = 0;
            }
            else {
              if ((uVar1 != 0x20) && (uVar1 != 0x18)) goto LAB_00255d0b;
              blue_mask = 0xff;
              green_mask = 0xff00;
              red_mask = 0xff0000;
              local_a0._0_1_ = 0x10;
              if (bVar25 == false) {
                local_d0 = 0;
              }
              else {
                uVar14 = calc_shift(alpha_mask);
                local_d0 = (byte)uVar14;
                uVar32 = uVar13 >> (local_d0 & 0x1f);
                bVar7 = false;
                if (uVar32 == 0xffffffff) goto LAB_00255c1c;
                local_94 = calc_scale(uVar32);
              }
              local_f0 = 0;
              local_90 = 0;
              local_c8 = 0;
              local_cc = 0;
              local_c4 = 8;
            }
          }
          else {
LAB_00255d0b:
            local_94 = 0;
            local_f0 = 0;
            local_c8 = 0;
            local_90 = 0;
            local_d0 = 0;
            local_cc = 0;
            local_c4 = 0;
            local_a0._0_1_ = 0;
          }
LAB_00255d43:
          QImage::setDotsPerMeterX(image,bi->biXPelsPerMeter);
          QImage::setDotsPerMeterY(image,bi->biYPelsPerMeter);
          if (((-1 < datapos) && (lVar17 = (**(code **)(*plVar3 + 0x78))(plVar3), lVar17 < datapos))
             && (cVar6 = (**(code **)(*plVar3 + 0x60))(plVar3), cVar6 == '\0')) {
            (**(code **)(*plVar3 + 0x88))(plVar3);
          }
          uVar18 = (ulong)RVar2.m_i;
          qVar19 = QImage::bytesPerLine(image);
          __s = QImage::bits(image);
          local_a8 = (int)qVar19;
          if (uVar1 == 0x20) {
LAB_00255ee6:
            pvVar24 = operator_new__((long)local_a8);
            lVar17 = (long)RVar4.m_i;
            while ((0 < lVar17 &&
                   (lVar27 = QIODevice::read((char *)plVar3,(longlong)pvVar24),
                   lVar27 == (RVar2.m_i * (short)uVar1 + 0x1f) / 0x20 << 2))) {
              lVar17 = lVar17 + -1;
              puVar31 = (uint *)(__s + lVar17 * local_a8);
              puVar21 = puVar31 + uVar18;
              puVar34 = (undefined1 *)((long)pvVar24 + 3);
              for (; puVar31 < puVar21; puVar31 = puVar31 + 1) {
                uVar32 = (uint)*(ushort *)(puVar34 + -3);
                if (0x10 < uVar1) {
                  uVar5 = CONCAT12(puVar34[-1],*(ushort *)(puVar34 + -3));
                  uVar32 = (uint)uVar5;
                  if (0x18 < uVar1) {
                    uVar32 = CONCAT13(*puVar34,uVar5);
                  }
                }
                uVar13 = apply_scale((red_mask & uVar32) >> ((byte)local_a0 & 0x1f),local_90);
                uVar14 = apply_scale((green_mask & uVar32) >> (local_c4 & 0x1f),local_c8);
                uVar15 = apply_scale((blue_mask & uVar32) >> (local_cc & 0x1f),local_f0);
                uVar28 = 0xff000000;
                if (bVar25 != false) {
                  uVar16 = apply_scale((uVar32 & alpha_mask) >> (local_d0 & 0x1f),local_94);
                  uVar28 = uVar16 << 0x18;
                }
                *puVar31 = uVar15 & 0xff | (uVar14 & 0xff) << 8 | (uVar13 & 0xff) << 0x10 | uVar28;
                puVar34 = puVar34 + ((uint)(int)(short)uVar1 >> 3);
              }
            }
LAB_00256772:
            operator_delete__(pvVar24);
          }
          else {
            if (uVar1 == 4) {
              uVar30 = (ulong)((int)(RVar2.m_i + 7U) / 8 << 2);
              pvVar24 = operator_new__(uVar30);
              if (iVar12 == 0) {
                memset(__s,0,(long)(RVar4.m_i * local_a8));
                iVar11 = RVar2.m_i / 2;
                if (iVar11 < 1) {
                  iVar11 = 0;
                }
                lVar17 = (long)RVar4.m_i;
                puVar35 = __s + (lVar17 + -1) * (long)local_a8 + 1;
                while ((0 < lVar17 &&
                       (uVar23 = QIODevice::read((char *)plVar3,(longlong)pvVar24), uVar23 == uVar30
                       ))) {
                  lVar17 = lVar17 + -1;
                  for (lVar27 = 0; iVar11 != (int)lVar27; lVar27 = lVar27 + 1) {
                    puVar35[lVar27 * 2 + -1] = *(byte *)((long)pvVar24 + lVar27) >> 4;
                    puVar35[lVar27 * 2] = *(byte *)((long)pvVar24 + lVar27) & 0xf;
                  }
                  if ((uVar18 & 1) != 0) {
                    puVar35[lVar27 * 2 + -1] = *(byte *)((long)pvVar24 + lVar27) >> 4;
                  }
                  puVar35 = puVar35 + -(long)local_a8;
                }
              }
              else if (iVar12 == 2) {
                _b = CONCAT31(uStack_3b,0xaa);
                pbVar29 = __s + (int)((RVar4.m_i - 1U) * local_a8);
                pbVar22 = pbVar29 + uVar18;
                uVar32 = 0;
                RVar33.m_i = 0;
                while ((uVar28 = RVar33.m_i, (int)uVar28 < RVar4.m_i &&
                       (cVar6 = QIODevice::getChar((char *)plVar3), cVar6 != '\0'))) {
                  uVar18 = (ulong)b;
                  if (uVar18 == 0) {
                    bVar8 = QIODevice::getChar((char *)plVar3);
                    RVar33.m_i = RVar4.m_i;
                    if ((b != '\x01' & bVar8) == 1) {
                      uVar18 = (ulong)b;
                      if ((_b & 0xff) == 2) {
                        QIODevice::getChar((char *)plVar3);
                        uVar32 = uVar32 + 0xaa;
                        QIODevice::getChar((char *)plVar3);
                        if ((uint)RVar2.m_i <= uVar32) {
                          uVar32 = RVar2.m_i - 1;
                        }
                        RVar33.m_i = uVar28 + 0xaa;
                        if ((uint)RVar4.m_i <= uVar28 + 0xaa) {
                          RVar33.m_i = RVar4.m_i - 1U;
                        }
                        pbVar29 = __s + (long)((~RVar33.m_i + RVar4.m_i) * local_a8) +
                                        (long)(int)uVar32;
                      }
                      else if ((_b & 0xff) == 0) {
                        pbVar29 = __s + (int)(((RVar4.m_i - 2U) - uVar28) * local_a8);
                        uVar32 = 0;
                        RVar33.m_i = uVar28 + 1;
                      }
                      else {
                        if (pbVar22 < pbVar29 + uVar18) {
                          uVar26 = (int)pbVar22 - (int)pbVar29;
                          uVar18 = (ulong)uVar26;
                          _b = CONCAT31(uStack_3b,(char)uVar26);
                        }
                        uVar30 = (uVar18 & 0xff) >> 1;
                        while (iVar11 = (int)uVar30, uVar30 = (ulong)(iVar11 - 1), iVar11 != 0) {
                          QIODevice::getChar((char *)plVar3);
                          *pbVar29 = b >> 4;
                          pbVar29[1] = b & 0xf;
                          pbVar29 = pbVar29 + 2;
                        }
                        if ((uVar18 & 1) != 0) {
                          QIODevice::getChar((char *)plVar3);
                          *pbVar29 = 10;
                          pbVar29 = pbVar29 + 1;
                        }
                        iVar11 = (int)(uVar18 & 0xff);
                        if ((iVar11 + 1U & 2) != 0) {
                          QIODevice::getChar((char *)plVar3);
                        }
                        uVar32 = uVar32 + iVar11;
                        RVar33.m_i = uVar28;
                      }
                    }
                  }
                  else {
                    if (pbVar22 < pbVar29 + uVar18) {
                      uVar26 = (int)pbVar22 - (int)pbVar29;
                      uVar18 = (ulong)uVar26;
                      _b = CONCAT31(uStack_3b,(char)uVar26);
                    }
                    local_a0 = (uint)uVar18 & 0xff;
                    uVar26 = ((uint)uVar18 & 0xff) >> 1;
                    QIODevice::getChar((char *)plVar3);
                    while( true ) {
                      bVar7 = uVar26 == 0;
                      uVar26 = uVar26 - 1;
                      if (bVar7) break;
                      *pbVar29 = b >> 4;
                      pbVar29[1] = b & 0xf;
                      pbVar29 = pbVar29 + 2;
                    }
                    if ((uVar18 & 1) != 0) {
                      *pbVar29 = b >> 4;
                      pbVar29 = pbVar29 + 1;
                    }
                    uVar32 = uVar32 + local_a0;
                    RVar33.m_i = uVar28;
                  }
                }
              }
              goto LAB_00256772;
            }
            if (uVar1 == 8) {
              if (iVar12 == 1) {
                _b = CONCAT31(uStack_3b,0xaa);
                __s_00 = __s + (int)((RVar4.m_i - 1U) * local_a8);
                puVar35 = __s_00 + RVar2.m_i;
                uVar32 = 0;
                RVar33.m_i = 0;
                while ((uVar28 = RVar33.m_i, (int)uVar28 < RVar4.m_i &&
                       (cVar6 = QIODevice::getChar((char *)plVar3), cVar6 != '\0'))) {
                  if ((ulong)b == 0) {
                    bVar8 = QIODevice::getChar((char *)plVar3);
                    RVar33.m_i = RVar4.m_i;
                    if ((b != '\x01' & bVar8) == 1) {
                      if ((ulong)b == 2) {
                        QIODevice::getChar((char *)plVar3);
                        uVar32 = uVar32 + 0xaa;
                        QIODevice::getChar((char *)plVar3);
                        if ((uint)RVar2.m_i <= uVar32) {
                          uVar32 = RVar2.m_i - 1;
                        }
                        RVar33.m_i = uVar28 + 0xaa;
                        if ((uint)RVar4.m_i <= uVar28 + 0xaa) {
                          RVar33.m_i = RVar4.m_i - 1U;
                        }
                        __s_00 = __s + (long)((~RVar33.m_i + RVar4.m_i) * local_a8) +
                                       (long)(int)uVar32;
                      }
                      else if (b == '\0') {
                        __s_00 = __s + (int)(((RVar4.m_i - 2U) - uVar28) * local_a8);
                        uVar32 = 0;
                        RVar33.m_i = uVar28 + 1;
                      }
                      else {
                        if (puVar35 < __s_00 + b) {
                          _b = CONCAT31(uStack_3b,(char)puVar35 - (char)__s_00);
                        }
                        uVar18 = QIODevice::read((char *)plVar3,(longlong)__s_00);
                        uVar30 = (ulong)b;
                        if (uVar18 != uVar30) goto LAB_00255c14;
                        if ((_b & 1) != 0) {
                          QIODevice::getChar((char *)plVar3);
                          uVar30 = (ulong)b;
                        }
                        uVar32 = uVar32 + b;
                        __s_00 = __s_00 + uVar30;
                        RVar33.m_i = uVar28;
                      }
                    }
                  }
                  else {
                    if (puVar35 < __s_00 + b) {
                      _b = CONCAT31(uStack_3b,(char)puVar35 - (char)__s_00);
                    }
                    QIODevice::getChar((char *)plVar3);
                    memset(__s_00,0xaa,(ulong)b);
                    uVar32 = uVar32 + (_b & 0xff);
                    __s_00 = __s_00 + b;
                    RVar33.m_i = uVar28;
                  }
                }
              }
              else if (iVar12 == 0) {
                lVar27 = (long)local_a8;
                puVar35 = __s + ((long)RVar4.m_i + -1) * lVar27;
                lVar17 = (long)RVar4.m_i + 1;
                do {
                  if (lVar17 + -1 == 0 || lVar17 < 1) break;
                  lVar20 = QIODevice::read((char *)plVar3,(longlong)puVar35);
                  puVar35 = puVar35 + -lVar27;
                  lVar17 = lVar17 + -1;
                } while (lVar20 == lVar27);
              }
            }
            else {
              if ((uVar1 == 0x10) || (uVar1 == 0x18)) goto LAB_00255ee6;
              if (uVar1 == 1) {
                lVar27 = (long)local_a8;
                puVar35 = __s + ((long)RVar4.m_i + -1) * lVar27;
                lVar17 = (long)RVar4.m_i + 1;
                do {
                  if (lVar17 + -1 == 0 || lVar17 < 1) break;
                  lVar20 = QIODevice::read((char *)plVar3,(longlong)puVar35);
                  puVar35 = puVar35 + -lVar27;
                  lVar17 = lVar17 + -1;
                } while (lVar20 == lVar27);
                if (colorCount == 2) {
                  QVar10 = QImage::color(image,0);
                  iVar11 = qGray(QVar10);
                  QVar10 = QImage::color(image,1);
                  iVar12 = qGray(QVar10);
                  if (((iVar11 < iVar12) && (iVar11 = QImage::depth(image), iVar11 == 1)) &&
                     (iVar11 = QImage::colorCount(image), iVar11 == 2)) {
                    puVar21 = (uint *)QImage::bits(image);
                    qVar19 = QImage::sizeInBytes(image);
                    lVar17 = 0;
                    if (0 < qVar19 / 4) {
                      lVar17 = qVar19 / 4;
                    }
                    while (bVar7 = lVar17 != 0, lVar17 = lVar17 + -1, bVar7) {
                      *puVar21 = ~*puVar21;
                      puVar21 = puVar21 + 1;
                    }
                    for (uVar18 = 0; ((uint)qVar19 & 3) != uVar18; uVar18 = uVar18 + 1) {
                      *(byte *)((long)puVar21 + uVar18) = ~*(byte *)((long)puVar21 + uVar18);
                    }
                    QVar10 = QImage::color(image,0);
                    c = QImage::color(image,1);
                    QImage::setColor(image,0,c);
                    QImage::setColor(image,1,QVar10);
                  }
                }
              }
            }
          }
          uVar32 = bi->biHeight;
          bVar7 = true;
          if ((int)uVar32 < 0) {
            uVar18 = (ulong)local_a8;
            pvVar24 = operator_new__(uVar18);
            uVar30 = (ulong)(-uVar32 >> 1);
            iVar11 = ~uVar32 * local_a8;
            puVar35 = __s;
            while (bVar7 = uVar30 != 0, uVar30 = uVar30 - 1, bVar7) {
              memcpy(pvVar24,puVar35,uVar18);
              memcpy(puVar35,__s + iVar11,uVar18);
              memcpy(__s + iVar11,pvVar24,uVar18);
              iVar11 = iVar11 - local_a8;
              puVar35 = puVar35 + uVar18;
            }
            operator_delete__(pvVar24);
            bVar7 = true;
          }
          goto LAB_00255c1c;
        }
        if (uVar28 != 0x20) {
          local_94 = 0;
          local_f0 = 0;
          local_c8 = 0;
          local_90 = 0;
          local_d0 = 0;
          local_cc = 0;
          local_c4 = 0;
          local_a0._0_1_ = 0;
          if (uVar28 != 0x10) goto LAB_00255d43;
        }
        uVar13 = calc_shift(red_mask);
        local_a0._0_1_ = (byte)uVar13;
        uVar32 = uVar14 >> ((byte)local_a0 & 0x1f);
        if (uVar32 != 0xffffffff) {
          local_90 = calc_scale(uVar32);
          uVar13 = green_mask;
          uVar14 = calc_shift(green_mask);
          local_c4 = (byte)uVar14;
          uVar32 = uVar13 >> (local_c4 & 0x1f);
          if (uVar32 != 0xffffffff) {
            local_c8 = calc_scale(uVar32);
            uVar14 = blue_mask;
            uVar15 = calc_shift(blue_mask);
            uVar13 = alpha_mask;
            local_cc = (byte)uVar15;
            uVar32 = uVar14 >> (local_cc & 0x1f);
            if (uVar32 != 0xffffffff) {
              uVar14 = calc_shift(alpha_mask);
              local_d0 = (byte)uVar14;
              uVar28 = uVar13 >> (local_d0 & 0x1f);
              if (uVar28 != 0xffffffff) {
                local_f0 = calc_scale(uVar32);
                local_94 = calc_scale(uVar28);
                goto LAB_00255d43;
              }
            }
          }
        }
      }
      else {
        QImage::setColorCount(image,colorCount);
        _b = 0xaaaaaaaa;
        i_00 = 0;
        do {
          if (colorCount == i_00) goto LAB_00255d0b;
          lVar17 = QIODevice::read((char *)plVar3,(longlong)&b);
          if (lVar17 != (ulong)(iVar11 != 0xc) + 3) break;
          QImage::setColor(image,i_00,_b & 0xffffff | 0xff000000);
          cVar6 = (**(code **)(*plVar3 + 0x90))(plVar3);
          i_00 = i_00 + 1;
        } while (cVar6 == '\0');
      }
    }
  }
LAB_00255c14:
  bVar7 = false;
LAB_00255c1c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

static bool read_dib_body(QDataStream &s, const BMP_INFOHDR &bi, qint64 datapos, qint64 startpos, QImage &image)
{
    QIODevice* d = s.device();
    if (d->atEnd())                                // end of stream/file
        return false;
#if 0
    qDebug("offset...........%lld", datapos);
    qDebug("startpos.........%lld", startpos);
    qDebug("biSize...........%d", bi.biSize);
    qDebug("biWidth..........%d", bi.biWidth);
    qDebug("biHeight.........%d", bi.biHeight);
    qDebug("biPlanes.........%d", bi.biPlanes);
    qDebug("biBitCount.......%d", bi.biBitCount);
    qDebug("biCompression....%d", bi.biCompression);
    qDebug("biSizeImage......%d", bi.biSizeImage);
    qDebug("biXPelsPerMeter..%d", bi.biXPelsPerMeter);
    qDebug("biYPelsPerMeter..%d", bi.biYPelsPerMeter);
    qDebug("biClrUsed........%d", bi.biClrUsed);
    qDebug("biClrImportant...%d", bi.biClrImportant);
#endif
    int w = bi.biWidth,         h = bi.biHeight,  nbits = bi.biBitCount;
    int t = bi.biSize,         comp = bi.biCompression;
    uint red_mask = 0;
    uint green_mask = 0;
    uint blue_mask = 0;
    uint alpha_mask = 0;
    uint red_shift = 0;
    uint green_shift = 0;
    uint blue_shift = 0;
    uint alpha_shift = 0;
    uint red_scale = 0;
    uint green_scale = 0;
    uint blue_scale = 0;
    uint alpha_scale = 0;
    bool bitfields = comp == BMP_BITFIELDS || comp == BMP_ALPHABITFIELDS;

    if (!d->isSequential())
        d->seek(startpos + bi.biSize); // goto start of colormap or masks

    if (bi.biSize >= BMP_WIN4) {
        red_mask = bi.biRedMask;
        green_mask = bi.biGreenMask;
        blue_mask = bi.biBlueMask;
        alpha_mask = bi.biAlphaMask;
    } else if (bitfields && (nbits == 16 || nbits == 32)) {
        if (d->read((char *)&red_mask, sizeof(red_mask)) != sizeof(red_mask))
            return false;
        if (d->read((char *)&green_mask, sizeof(green_mask)) != sizeof(green_mask))
            return false;
        if (d->read((char *)&blue_mask, sizeof(blue_mask)) != sizeof(blue_mask))
            return false;
        if (comp == BMP_ALPHABITFIELDS && d->read((char *)&alpha_mask, sizeof(alpha_mask)) != sizeof(alpha_mask))
            return false;
    }

    bool transp = bitfields || (comp == BMP_RGB && nbits == 32 && alpha_mask == 0xff000000);
    transp = transp && alpha_mask;

    int ncols = 0;
    int depth = 0;
    QImage::Format format;
    switch (nbits) {
        case 32:
        case 24:
        case 16:
            depth = 32;
            format = transp ? QImage::Format_ARGB32 : QImage::Format_RGB32;
            break;
        case 8:
        case 4:
            depth = 8;
            format = QImage::Format_Indexed8;
            break;
        case 1:
            depth = 1;
            format = QImage::Format_Mono;
            break;
        default:
            return false;
            break;
    }

    if (depth != 32) {
        ncols = bi.biClrUsed ? bi.biClrUsed : 1 << nbits;
        if (ncols < 1 || ncols > 256) // sanity check - don't run out of mem if color table is broken
            return false;
    }

    if (bi.biHeight < 0)
        h = -h;                  // support images with negative height

    if (!QImageIOHandler::allocateImage(QSize(w, h), format, &image))
        return false;
    if (ncols > 0) {                                // read color table
        image.setColorCount(ncols);
        uchar rgb[4];
        int   rgb_len = t == BMP_OLD ? 3 : 4;
        for (int i=0; i<ncols; i++) {
            if (d->read((char *)rgb, rgb_len) != rgb_len)
                return false;
            image.setColor(i, qRgb(rgb[2],rgb[1],rgb[0]));
            if (d->atEnd())                        // truncated file
                return false;
        }
    } else if (bitfields && (nbits == 16 || nbits == 32)) {
        red_shift = calc_shift(red_mask);
        if (((red_mask >> red_shift) + 1) == 0)
            return false;
        red_scale = calc_scale(red_mask >> red_shift);
        green_shift = calc_shift(green_mask);
        if (((green_mask >> green_shift) + 1) == 0)
            return false;
        green_scale = calc_scale(green_mask >> green_shift);
        blue_shift = calc_shift(blue_mask);
        if (((blue_mask >> blue_shift) + 1) == 0)
            return false;
        blue_scale = calc_scale(blue_mask >> blue_shift);
        alpha_shift = calc_shift(alpha_mask);
        if (((alpha_mask >> alpha_shift) + 1) == 0)
            return false;
        alpha_scale = calc_scale(alpha_mask >> alpha_shift);
    } else if (comp == BMP_RGB && (nbits == 24 || nbits == 32)) {
        blue_mask = 0x000000ff;
        green_mask = 0x0000ff00;
        red_mask = 0x00ff0000;
        blue_shift = 0;
        green_shift = 8;
        red_shift = 16;
        blue_scale = green_scale = red_scale = 0;
        if (transp) {
            alpha_shift = calc_shift(alpha_mask);
            if (((alpha_mask >> alpha_shift) + 1) == 0)
                return false;
            alpha_scale = calc_scale(alpha_mask >> alpha_shift);
        }
    } else if (comp == BMP_RGB && nbits == 16) {
        blue_mask = 0x001f;
        green_mask = 0x03e0;
        red_mask = 0x7c00;
        blue_shift = 0;
        green_shift = 5;
        red_shift = 10;
        blue_scale = green_scale = red_scale = 3;
    }

    image.setDotsPerMeterX(bi.biXPelsPerMeter);
    image.setDotsPerMeterY(bi.biYPelsPerMeter);

#if 0
    qDebug("Rmask: %08x Rshift: %08x Rscale:%08x", red_mask, red_shift, red_scale);
    qDebug("Gmask: %08x Gshift: %08x Gscale:%08x", green_mask, green_shift, green_scale);
    qDebug("Bmask: %08x Bshift: %08x Bscale:%08x", blue_mask, blue_shift, blue_scale);
    qDebug("Amask: %08x Ashift: %08x Ascale:%08x", alpha_mask, alpha_shift, alpha_scale);
#endif

    if (datapos >= 0 && datapos > d->pos()) {
        if (!d->isSequential())
            d->seek(datapos); // start of image data
    }

    int             bpl = image.bytesPerLine();
    uchar *data = image.bits();

    if (nbits == 1) {                                // 1 bit BMP image
        while (--h >= 0) {
            if (d->read((char*)(data + h*bpl), bpl) != bpl)
                break;
        }
        if (ncols == 2 && qGray(image.color(0)) < qGray(image.color(1)))
            swapPixel01(&image);                // pixel 0 is white!
    }

    else if (nbits == 4) {                        // 4 bit BMP image
        int    buflen = ((w+7)/8)*4;
        uchar *buf    = new uchar[buflen];
        if (comp == BMP_RLE4) {                // run length compression
            int x=0, y=0, c, i;
            quint8 b;
            uchar *p = data + (h-1)*bpl;
            const uchar *endp = p + w;
            while (y < h) {
                if (!d->getChar((char *)&b))
                    break;
                if (b == 0) {                        // escape code
                    if (!d->getChar((char *)&b) || b == 1) {
                        y = h;                // exit loop
                    } else switch (b) {
                        case 0:                        // end of line
                            x = 0;
                            y++;
                            p = data + (h-y-1)*bpl;
                            break;
                        case 2:                        // delta (jump)
                        {
                            quint8 tmp;
                            d->getChar((char *)&tmp);
                            x += tmp;
                            d->getChar((char *)&tmp);
                            y += tmp;
                        }

                            // Protection
                            if ((uint)x >= (uint)w)
                                x = w-1;
                            if ((uint)y >= (uint)h)
                                y = h-1;

                            p = data + (h-y-1)*bpl + x;
                            break;
                        default:                // absolute mode
                            // Protection
                            if (p + b > endp)
                                b = endp-p;

                            i = (c = b)/2;
                            while (i--) {
                                d->getChar((char *)&b);
                                *p++ = b >> 4;
                                *p++ = b & 0x0f;
                            }
                            if (c & 1) {
                                unsigned char tmp;
                                d->getChar((char *)&tmp);
                                *p++ = tmp >> 4;
                            }
                            if ((((c & 3) + 1) & 2) == 2)
                                d->getChar(nullptr);        // align on word boundary
                            x += c;
                    }
                } else {                        // encoded mode
                    // Protection
                    if (p + b > endp)
                        b = endp-p;

                    i = (c = b)/2;
                    d->getChar((char *)&b);                // 2 pixels to be repeated
                    while (i--) {
                        *p++ = b >> 4;
                        *p++ = b & 0x0f;
                    }
                    if (c & 1)
                        *p++ = b >> 4;
                    x += c;
                }
            }
        } else if (comp == BMP_RGB) {                // no compression
            memset(data, 0, h*bpl);
            while (--h >= 0) {
                if (d->read((char*)buf,buflen) != buflen)
                    break;
                uchar *p = data + h*bpl;
                uchar *b = buf;
                for (int i=0; i<w/2; i++) {        // convert nibbles to bytes
                    *p++ = *b >> 4;
                    *p++ = *b++ & 0x0f;
                }
                if (w & 1)                        // the last nibble
                    *p = *b >> 4;
            }
        }
        delete [] buf;
    }

    else if (nbits == 8) {                        // 8 bit BMP image
        if (comp == BMP_RLE8) {                // run length compression
            int x=0, y=0;
            quint8 b;
            uchar *p = data + (h-1)*bpl;
            const uchar *endp = p + w;
            while (y < h) {
                if (!d->getChar((char *)&b))
                    break;
                if (b == 0) {                        // escape code
                    if (!d->getChar((char *)&b) || b == 1) {
                            y = h;                // exit loop
                    } else switch (b) {
                        case 0:                        // end of line
                            x = 0;
                            y++;
                            p = data + (h-y-1)*bpl;
                            break;
                        case 2:                        // delta (jump)
                            {
                                quint8 tmp;
                                d->getChar((char *)&tmp);
                                x += tmp;
                                d->getChar((char *)&tmp);
                                y += tmp;
                            }

                            // Protection
                            if ((uint)x >= (uint)w)
                                x = w-1;
                            if ((uint)y >= (uint)h)
                                y = h-1;

                            p = data + (h-y-1)*bpl + x;
                            break;
                        default:                // absolute mode
                            // Protection
                            if (p + b > endp)
                                b = endp-p;

                            if (d->read((char *)p, b) != b)
                                return false;
                            if ((b & 1) == 1)
                                d->getChar(nullptr);        // align on word boundary
                            x += b;
                            p += b;
                    }
                } else {                        // encoded mode
                    // Protection
                    if (p + b > endp)
                        b = endp-p;

                    char tmp;
                    d->getChar(&tmp);
                    memset(p, tmp, b); // repeat pixel
                    x += b;
                    p += b;
                }
            }
        } else if (comp == BMP_RGB) {                // uncompressed
            while (--h >= 0) {
                if (d->read((char *)data + h*bpl, bpl) != bpl)
                    break;
            }
        }
    }

    else if (nbits == 16 || nbits == 24 || nbits == 32) { // 16,24,32 bit BMP image
        QRgb *p;
        QRgb  *end;
        uchar *buf24 = new uchar[bpl];
        int    bpl24 = ((w*nbits+31)/32)*4;
        uchar *b;
        int c;

        while (--h >= 0) {
            p = (QRgb *)(data + h*bpl);
            end = p + w;
            if (d->read((char *)buf24,bpl24) != bpl24)
                break;
            b = buf24;
            while (p < end) {
                c = *(uchar*)b | (*(uchar*)(b+1)<<8);
                if (nbits > 16)
                    c |= *(uchar*)(b+2)<<16;
                if (nbits > 24)
                    c |= *(uchar*)(b+3)<<24;
                *p++ = qRgba(apply_scale((c & red_mask) >> red_shift, red_scale),
                             apply_scale((c & green_mask) >> green_shift, green_scale),
                             apply_scale((c & blue_mask) >> blue_shift, blue_scale),
                             transp ? apply_scale((c & alpha_mask) >> alpha_shift, alpha_scale) : 0xff);
                b += nbits/8;
            }
        }
        delete[] buf24;
    }

    if (bi.biHeight < 0) {
        // Flip the image
        uchar *buf = new uchar[bpl];
        h = -bi.biHeight;
        for (int y = 0; y < h/2; ++y) {
            memcpy(buf, data + y*bpl, bpl);
            memcpy(data + y*bpl, data + (h-y-1)*bpl, bpl);
            memcpy(data + (h-y-1)*bpl, buf, bpl);
        }
        delete [] buf;
    }

    return true;
}